

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.c
# Opt level: O1

int ops_scan(char *ops,void *ops_cache,d_loc_t *loc,uchar *op_assoc,int *op_priority)

{
  bool bVar1;
  
  bVar1 = *loc->s == '+';
  if (bVar1) {
    loc->s = loc->s + 1;
    *op_assoc = '\x11';
    *op_priority = 0x251c;
  }
  return (uint)bVar1;
}

Assistant:

int ops_scan(char *ops, void *ops_cache, d_loc_t *loc, unsigned char *op_assoc, int *op_priority) {
  (void)ops;
  (void)ops_cache;
  if (loc->s[0] == '+') {
    loc->s++;
    *op_assoc = ASSOC_BINARY_LEFT;
    *op_priority = 9500;
    return 1;
  }
  return 0;
}